

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

void mg_destroy_conn(mg_connection *conn)

{
  mg_if_destroy_conn(conn);
  mbuf_free(&conn->recv_mbuf);
  mbuf_free(&conn->send_mbuf);
  free(conn);
  return;
}

Assistant:

static void mg_destroy_conn(struct mg_connection *conn) {
    mg_if_destroy_conn(conn);
#ifdef MG_ENABLE_SSL
                                                                                                                            if (conn->ssl != NULL) SSL_free(conn->ssl);
  if (conn->ssl_ctx != NULL) SSL_CTX_free(conn->ssl_ctx);
#endif
    mbuf_free(&conn->recv_mbuf);
    mbuf_free(&conn->send_mbuf);
    memset(conn, 0, sizeof(*conn));
    MG_FREE(conn);
}